

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O3

void __thiscall
poplar::compact_bonsai_nlm<int,_64UL>::compact_bonsai_nlm
          (compact_bonsai_nlm<int,_64UL> *this,uint32_t capa_bits)

{
  allocator_type local_12;
  allocator_type local_11;
  
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::vector(&this->ptrs_,(ulong)(1L << ((ulong)capa_bits & 0x3f)) >> 6,&local_11);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->chunks_,
             (long)(this->ptrs_).
                   super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ptrs_).
                   super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_12);
  this->size_ = 0;
  this->label_bytes_ = 0;
  return;
}

Assistant:

explicit compact_bonsai_nlm(uint32_t capa_bits) : ptrs_((1ULL << capa_bits) / ChunkSize), chunks_(ptrs_.size()) {}